

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O3

void ihevc_inter_pred_luma_copy_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < ht) {
    iVar1 = 0;
    do {
      if (0 < wd) {
        uVar2 = 0;
        do {
          pi2_dst[uVar2] = (ushort)pu1_src[uVar2] << 6;
          uVar2 = uVar2 + 1;
        } while ((uint)wd != uVar2);
      }
      pu1_src = pu1_src + src_strd;
      iVar1 = iVar1 + 1;
      pi2_dst = pi2_dst + dst_strd;
    } while (iVar1 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_copy_w16out(UWORD8 *pu1_src,
                                       WORD16 *pi2_dst,
                                       WORD32 src_strd,
                                       WORD32 dst_strd,
                                       WORD8 *pi1_coeff,
                                       WORD32 ht,
                                       WORD32 wd)
{
    WORD32 row, col;
    UNUSED(pi1_coeff);
    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH);
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }

}